

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_data.cpp
# Opt level: O2

void __thiscall duckdb::BufferedData::~BufferedData(BufferedData *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

BufferedData::~BufferedData() {
}